

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O0

string * __thiscall
HDD::GetIdentifyString_abi_cxx11_(string *__return_storage_ptr__,HDD *this,void *p,size_t n)

{
  char *pcVar1;
  char *__b;
  string local_70;
  char *local_50;
  size_t i;
  allocator local_32;
  undefined1 local_31;
  void *local_30;
  char *pcsz;
  size_t n_local;
  void *p_local;
  HDD *this_local;
  string *s;
  
  pcsz = (char *)(n & 0xfffffffffffffffe);
  pcVar1 = pcsz;
  local_31 = 0;
  local_30 = p;
  n_local = (size_t)p;
  p_local = this;
  this_local = (HDD *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)p,(ulong)pcVar1,&local_32);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  for (local_50 = (char *)0x0; local_50 < pcsz; local_50 = local_50 + 2) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    __b = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    std::swap<char>(pcVar1,__b);
  }
  util::trim(&local_70,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string HDD::GetIdentifyString(void* p, size_t n)
{
    // Buffer length must be even
    n &= ~1;

    auto pcsz = reinterpret_cast<const char*>(p);
    std::string s(pcsz, n);

    // Copy the string, up to the size of the buffer
    for (size_t i = 0; i < n; i += 2)
        std::swap(s[i], s[i + 1]);

    // Trim leading and trailing spaces
    s = util::trim(s);

    return s;
}